

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_spawn.cxx
# Opt level: O1

void __thiscall xray_re::xr_level_spawn::load(xr_level_spawn *this,xr_reader *r)

{
  pointer *pppcVar1;
  iterator __position;
  char *name;
  uint32_t id;
  uint16_t pkt_id;
  cse_abstract *entity;
  xr_packet packet;
  uint16_t local_1062;
  cse_abstract *local_1060;
  xr_reader *local_1058;
  vector<xray_re::cse_abstract*,std::allocator<xray_re::cse_abstract*>> *local_1050;
  xr_packet local_1048;
  
  local_1058 = xr_reader::open_chunk(r,0);
  if (local_1058 != (xr_reader *)0x0) {
    local_1050 = (vector<xray_re::cse_abstract*,std::allocator<xray_re::cse_abstract*>> *)
                 &this->m_spawns;
    id = 1;
    do {
      xr_packet::xr_packet(&local_1048);
      if (local_1058->m_end < local_1058->m_data) {
        __assert_fail("m_data <= m_end",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_reader.h"
                      ,0x7a,"size_t xray_re::xr_reader::size() const");
      }
      xr_reader::r_packet(local_1058,&local_1048,(long)local_1058->m_end - (long)local_1058->m_data)
      ;
      xr_packet::r_begin(&local_1048,&local_1062);
      if (local_1062 != 1) {
        __assert_fail("pkt_id == M_SPAWN",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_spawn.cxx"
                      ,0x16,"void xray_re::xr_level_spawn::load(xr_reader &)");
      }
      name = xr_packet::skip_sz(&local_1048);
      local_1048.m_r_pos = 0;
      local_1060 = create_entity(name);
      if (local_1060 != (cse_abstract *)0x0) {
        cse_abstract::spawn_read(local_1060,&local_1048);
        if (local_1048.m_r_pos != local_1048.m_w_pos) {
          msg("reading %s (%s): %u <> %u",(local_1060->m_s_name_replace)._M_dataplus._M_p,name);
        }
        __position._M_current =
             (this->m_spawns).
             super__Vector_base<xray_re::cse_abstract_*,_std::allocator<xray_re::cse_abstract_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->m_spawns).
            super__Vector_base<xray_re::cse_abstract_*,_std::allocator<xray_re::cse_abstract_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<xray_re::cse_abstract*,std::allocator<xray_re::cse_abstract*>>::
          _M_realloc_insert<xray_re::cse_abstract*const&>(local_1050,__position,&local_1060);
        }
        else {
          *__position._M_current = local_1060;
          pppcVar1 = &(this->m_spawns).
                      super__Vector_base<xray_re::cse_abstract_*,_std::allocator<xray_re::cse_abstract_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppcVar1 = *pppcVar1 + 1;
        }
      }
      xr_reader::close_chunk(r,&local_1058);
      local_1058 = xr_reader::open_chunk(r,id);
      id = id + 1;
    } while (local_1058 != (xr_reader *)0x0);
  }
  return;
}

Assistant:

void xr_level_spawn::load(xr_reader& r)
{
	xr_reader* s;
	for (uint32_t id = 0; (s = r.open_chunk(id)); ++id) {
		xr_packet packet;
		s->r_packet(packet, s->size());
		uint16_t pkt_id;
		packet.r_begin(pkt_id);
		xr_assert(pkt_id == M_SPAWN);
		const char* name = packet.skip_sz();
		packet.r_seek(0);
		// just skip the spawn record if we can't create it.
		if (cse_abstract* entity = create_entity(name)) {
			entity->spawn_read(packet);
			if (!packet.r_eof()) {
				msg("reading %s (%s): %u <> %u", entity->name_replace().c_str(),
						name, packet.r_tell(), packet.w_tell());
			}
			m_spawns.push_back(entity);
		}
		r.close_chunk(s);
	}
}